

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInput.cpp
# Opt level: O0

void __thiscall gr::GrBufferIStream::ReadBlockFromFont(GrBufferIStream *this,void *pvInput,int cb)

{
  undefined4 *puVar1;
  int in_EDX;
  uchar *in_RSI;
  uchar *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((*(long *)(in_RDI + 0x18) != 0) &&
     ((in_EDX < 0 || (*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10) < (long)in_EDX)))) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0x80000001;
    __cxa_throw(puVar1,&GrResult::typeinfo,0);
  }
  std::copy<unsigned_char*,unsigned_char*>
            (in_RSI,(uchar *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RDI);
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + (long)in_EDX;
  return;
}

Assistant:

void GrBufferIStream::ReadBlockFromFont(void * pvInput, int cb)
{
    if (m_pbLim && (cb < 0 || cb > m_pbLim - m_pbNext))
        THROW(kresReadFault);
	std::copy(m_pbNext, m_pbNext + cb, reinterpret_cast<byte*>(pvInput));
	m_pbNext += cb;
}